

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O0

mraa_boolean_t mraa_link_targets(char *filename,char *targetname)

{
  char *pcVar1;
  ssize_t sVar2;
  char *old_buffer;
  char *buffer;
  int nchars;
  int size;
  char *targetname_local;
  char *filename_local;
  
  buffer._4_4_ = 100;
  buffer._0_4_ = 0;
  old_buffer = (char *)0x0;
  while( true ) {
    if ((int)buffer != 0) {
      pcVar1 = strstr(old_buffer,targetname);
      if (pcVar1 == (char *)0x0) {
        free(old_buffer);
      }
      else {
        free(old_buffer);
      }
      filename_local._4_4_ = (uint)(pcVar1 != (char *)0x0);
      return filename_local._4_4_;
    }
    pcVar1 = (char *)realloc(old_buffer,(long)buffer._4_4_);
    if (pcVar1 == (char *)0x0) break;
    sVar2 = readlink(filename,pcVar1,(long)buffer._4_4_);
    buffer._0_4_ = (int)sVar2;
    if ((int)buffer < 0) {
      free(pcVar1);
      return 0;
    }
    pcVar1[(int)buffer] = '\0';
    old_buffer = pcVar1;
    if (buffer._4_4_ <= (int)buffer) {
      buffer._4_4_ = buffer._4_4_ << 1;
      buffer._0_4_ = 0;
    }
  }
  free(old_buffer);
  return 0;
}

Assistant:

mraa_boolean_t
mraa_link_targets(const char* filename, const char* targetname)
{
    int size = 100;
    int nchars = 0;
    char* buffer = NULL;
    while (nchars == 0) {
        char* old_buffer = buffer;
        buffer = (char*) realloc(buffer, size);
        if (buffer == NULL) {
            free(old_buffer);
            return 0;
        }
        nchars = readlink(filename, buffer, size);
        if (nchars < 0) {
            free(buffer);
            return 0;
        } else {
            buffer[nchars] = '\0';
        }
        if (nchars >= size) {
            size *= 2;
            nchars = 0;
        }
    }
    if (strstr(buffer, targetname)) {
        free(buffer);
        return 1;
    } else {
        free(buffer);
        return 0;
    }
}